

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::process_and_close_socket<std::function<bool(httplib::Stream&,bool,bool&)>>
               (bool is_client_request,socket_t sock,size_t keep_alive_max_count,
               time_t read_timeout_sec,time_t read_timeout_usec,
               function<bool_(httplib::Stream_&,_bool,_bool_&)> *callback)

{
  bool bVar1;
  int iVar2;
  bool connection_close;
  fd_set fds;
  bool local_e5;
  int local_e4;
  timeval local_e0;
  long local_d0;
  ulong local_c8;
  time_t local_c0;
  fd_set local_b8;
  
  if (keep_alive_max_count != 1) {
    local_c0 = read_timeout_usec;
    if (keep_alive_max_count == 0) {
      __assert_fail("keep_alive_max_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/build_O1/external/httplib/src/httplib/httplib.h"
                    ,0x4aa,
                    "bool httplib::detail::process_and_close_socket(bool, socket_t, size_t, time_t, time_t, T) [T = std::function<bool (httplib::Stream &, bool, bool &)>]"
                   );
    }
    iVar2 = sock + 0x3f;
    if (-1 < sock) {
      iVar2 = sock;
    }
    local_c8 = 1L << ((byte)sock & 0x3f);
    local_d0 = (long)(iVar2 >> 6);
    local_e4 = sock + 1;
    bVar1 = false;
    do {
      if (!is_client_request) {
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[local_d0] = local_b8.fds_bits[local_d0] | local_c8;
        local_e0.tv_sec = 5;
        local_e0.tv_usec = 0;
        iVar2 = select(local_e4,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_e0);
        if (iVar2 < 1) goto LAB_00174a91;
      }
      local_b8.fds_bits[0] = (__fd_mask)&PTR__Stream_003d74a8;
      local_b8.fds_bits[1] = CONCAT44(local_b8.fds_bits[1]._4_4_,sock);
      local_e0.tv_sec = CONCAT71(local_e0.tv_sec._1_7_,keep_alive_max_count == 1);
      local_b8.fds_bits[3] = local_c0;
      local_e5 = false;
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00174ab1;
      local_b8.fds_bits[2] = read_timeout_sec;
      bVar1 = (*callback->_M_invoker)
                        ((_Any_data *)callback,(Stream *)&local_b8,(bool *)&local_e0,&local_e5);
      if (((!bVar1) || ((local_e5 & 1U) != 0)) ||
         (keep_alive_max_count = keep_alive_max_count - (bVar1 & (local_e5 ^ 1U)),
         keep_alive_max_count == 0)) goto LAB_00174a91;
    } while( true );
  }
  local_b8.fds_bits[0] = (__fd_mask)&PTR__Stream_003d74a8;
  local_b8.fds_bits[1] = CONCAT44(local_b8.fds_bits[1]._4_4_,sock);
  local_e5 = false;
  local_e0.tv_sec = CONCAT71(local_e0.tv_sec._1_7_,1);
  local_b8.fds_bits[3] = read_timeout_usec;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00174ab1:
    local_b8.fds_bits[0] = (__fd_mask)&PTR__Stream_003d74a8;
    local_e5 = false;
    local_b8.fds_bits[2] = read_timeout_sec;
    std::__throw_bad_function_call();
  }
  local_b8.fds_bits[2] = read_timeout_sec;
  bVar1 = (*callback->_M_invoker)
                    ((_Any_data *)callback,(Stream *)&local_b8,(bool *)&local_e0,&local_e5);
LAB_00174a91:
  close(sock);
  return bVar1;
}

Assistant:

inline bool process_and_close_socket(bool is_client_request, socket_t sock,
                                     size_t keep_alive_max_count,
                                     time_t read_timeout_sec,
                                     time_t read_timeout_usec, T callback) {
  assert(keep_alive_max_count > 0);

  bool ret = false;

  if (keep_alive_max_count > 1) {
    auto count = keep_alive_max_count;
    while (count > 0 &&
           (is_client_request ||
            detail::select_read(sock, CPPHTTPLIB_KEEPALIVE_TIMEOUT_SECOND,
                                CPPHTTPLIB_KEEPALIVE_TIMEOUT_USECOND) > 0)) {
      SocketStream strm(sock, read_timeout_sec, read_timeout_usec);
      auto last_connection = count == 1;
      auto connection_close = false;

      ret = callback(strm, last_connection, connection_close);
      if (!ret || connection_close) { break; }

      count--;
    }
  } else {
    SocketStream strm(sock, read_timeout_sec, read_timeout_usec);
    auto dummy_connection_close = false;
    ret = callback(strm, true, dummy_connection_close);
  }

  close_socket(sock);
  return ret;
}